

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real.c
# Opt level: O3

void fft_r2c_exec(fft_real_object obj,double *inp,fft_data *oup)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  fft_object obj_00;
  fft_data *inp_00;
  fft_data *oup_00;
  size_t sVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  size_t __size;
  double dVar12;
  double dVar13;
  
  obj_00 = obj->cobj;
  iVar7 = obj_00->N;
  lVar11 = (long)iVar7;
  __size = lVar11 * 0x10;
  inp_00 = (fft_data *)malloc(__size);
  oup_00 = (fft_data *)malloc(__size);
  if (0 < lVar11) {
    sVar8 = 0;
    do {
      *(undefined8 *)((long)&inp_00->re + sVar8) = *(undefined8 *)((long)inp + sVar8);
      *(undefined8 *)((long)&inp_00->im + sVar8) = *(undefined8 *)((long)inp + sVar8 + 8);
      sVar8 = sVar8 + 0x10;
    } while (__size != sVar8);
  }
  fft_exec(obj_00,inp_00,oup_00);
  dVar1 = oup_00->re;
  dVar2 = oup_00->im;
  oup->re = dVar1 + dVar2;
  oup->im = 0.0;
  if (iVar7 < 2) {
    oup[lVar11].re = dVar1 - dVar2;
    oup[lVar11].im = 0.0;
  }
  else {
    pdVar9 = &oup_00[lVar11 + -1].im;
    lVar10 = 0;
    do {
      dVar3 = *(double *)((long)&oup_00[1].re + lVar10);
      dVar4 = *(double *)((long)&oup_00[1].im + lVar10);
      dVar5 = *pdVar9;
      dVar12 = dVar4 + dVar5;
      dVar13 = ((fft_data *)(pdVar9 + -1))->re - dVar3;
      dVar6 = *(double *)((long)&obj[1].twiddle2[0].re + lVar10);
      *(double *)((long)&oup[1].re + lVar10) =
           (dVar13 * dVar6 +
           *(double *)((long)obj[1].twiddle2 + lVar10 + -8) * dVar12 +
           ((fft_data *)(pdVar9 + -1))->re + dVar3) * 0.5;
      *(double *)((long)&oup[1].im + lVar10) =
           ((dVar13 * *(double *)((long)obj[1].twiddle2 + lVar10 + -8) + (dVar4 - dVar5)) -
           dVar12 * dVar6) * 0.5;
      pdVar9 = pdVar9 + -2;
      lVar10 = lVar10 + 0x10;
    } while (__size - 0x10 != lVar10);
    oup[lVar11].re = dVar1 - dVar2;
    oup[lVar11].im = 0.0;
    if (1 < iVar7) {
      pdVar9 = &oup[(ulong)(uint)(iVar7 * 2) - 1].im;
      lVar11 = 0;
      do {
        ((fft_data *)(pdVar9 + -1))->re = *(double *)((long)&oup[1].re + lVar11);
        *pdVar9 = -*(double *)((long)&oup[1].im + lVar11);
        pdVar9 = pdVar9 + -2;
        lVar11 = lVar11 + 0x10;
      } while (__size - 0x10 != lVar11);
    }
  }
  free(inp_00);
  free(oup_00);
  return;
}

Assistant:

void fft_r2c_exec(fft_real_object obj,fft_type *inp,fft_data *oup) {
	fft_data* cinp;
	fft_data* coup;
	int i,N2,N;
	fft_type temp1,temp2;
	N2 = obj->cobj->N;
	N = N2*2;
	
	cinp = (fft_data*) malloc (sizeof(fft_data) * N2);
	coup = (fft_data*) malloc (sizeof(fft_data) * N2);
	
	for (i = 0; i < N2; ++i) {
		cinp[i].re = inp[2*i];
		cinp[i].im = inp[2*i+1];
	}
	
	fft_exec(obj->cobj,cinp,coup);
	
	oup[0].re = coup[0].re + coup[0].im;
	oup[0].im = 0.0;
	
	for (i = 1; i < N2; ++i) {
		temp1 = coup[i].im + coup[N2-i].im ;
		temp2 = coup[N2-i].re - coup[i].re ;
		oup[i].re = (coup[i].re + coup[N2-i].re + (temp1 * obj->twiddle2[i].re) + (temp2 * obj->twiddle2[i].im)) / 2.0;
		oup[i].im = (coup[i].im - coup[N2-i].im + (temp2 * obj->twiddle2[i].re) - (temp1 * obj->twiddle2[i].im)) / 2.0;
	}
	
	
	
	oup[N2].re = coup[0].re - coup[0].im;
	oup[N2].im = 0.0;
	
	for (i = 1; i < N2;++i) {
		oup[N-i].re = oup[i].re; 
		oup[N-i].im = -oup[i].im; 
	}
	
		
	free(cinp);
	free(coup);

}